

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZGeoBlend<pzgeom::TPZGeoLinear> *cp,
          TPZGeoMesh *destmesh)

{
  int64_t iVar1;
  TPZGeoEl *pTVar2;
  long lVar3;
  TPZGeoEl **ppTVar4;
  TPZTransform<double> *t;
  TPZTransform<double> *this_00;
  
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018bab28;
  iVar1 = (cp->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1];
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0] =
       (cp->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0];
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1] = iVar1;
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_018b6630;
  lVar3 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar3) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar3) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar3) = 0xffffffffffffffff;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x30);
  this_00 = (TPZTransform<double> *)&this->field_0x50;
  lVar3 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)((long)this_00 + lVar3));
    lVar3 = lVar3 + 0x1a0;
  } while (lVar3 != 0x340);
  iVar1 = cp->fGeoEl->fIndex;
  t = (TPZTransform<double> *)&cp->field_0x50;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar3) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar3);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar3) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar3);
    TPZTransform<double>::operator=(this_00,t);
    lVar3 = lVar3 + 0x18;
    t = t + 1;
    this_00 = this_00 + 1;
  } while (lVar3 == 0x18);
  ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(destmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,iVar1);
  pTVar2 = *ppTVar4;
  this->fGeoEl = pTVar2;
  if (pTVar2 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1d);
  }
  return;
}

Assistant:

pzgeom::TPZGeoBlend<TGeo>::TPZGeoBlend(const TPZGeoBlend<TGeo> &cp, TPZGeoMesh &destmesh) : TPZRegisterClassId(&TPZGeoBlend<TGeo>::ClassId), TGeo(cp,destmesh)
{
    int64_t gelindex = cp.fGeoEl->Index();
    for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
        fNeighbours[is] =  cp.fNeighbours[is];
        fTrans[is] =  cp.fTrans[is];
    }
    fGeoEl = destmesh.Element(gelindex);
    if(!fGeoEl) DebugStop();
}